

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingOpenCV.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  int iVar2;
  Result *pRVar3;
  allocator<char> local_1e9;
  _InputArray local_1e8;
  Barcodes barcodes;
  Result *local_1c8;
  undefined8 local_1b8;
  undefined4 local_1b0;
  VideoCapture cap;
  Mat image;
  Result local_108;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&image,"Display window",(allocator<char> *)&cap);
  cv::namedWindow((string *)&image,1);
  std::__cxx11::string::~string((string *)&image);
  cv::Mat::Mat(&image);
  cv::VideoCapture::VideoCapture(&cap,0,0);
  cVar1 = cv::VideoCapture::isOpened();
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cout,"cannot open camera");
  }
  else {
    while( true ) {
      iVar2 = cv::waitKey(0x19);
      if (iVar2 == 0x1b) break;
      cv::VideoCapture::operator>>(&cap,&image);
      local_1b8 = 0x1f4ff0200080d2f;
      local_1b0 = 0;
      ReadBarcodes((Mat *)&barcodes,(ReaderOptions *)&image);
      for (pRVar3 = _barcodes; pRVar3 != local_1c8; pRVar3 = pRVar3 + 1) {
        ZXing::Result::Result(&local_108,pRVar3);
        DrawBarcode(&image,&local_108);
        ZXing::Result::~Result(&local_108);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"Display window",&local_1e9);
      local_1e8.sz.width = 0;
      local_1e8.sz.height = 0;
      local_1e8.flags = 0x1010000;
      local_1e8.obj = (ReaderOptions *)&image;
      cv::imshow((string *)&local_1b8,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)&barcodes);
    }
  }
  cv::VideoCapture::~VideoCapture(&cap);
  cv::Mat::~Mat(&image);
  return 0;
}

Assistant:

int main()
{
	namedWindow("Display window");

	Mat image;
	VideoCapture cap(0);

	if (!cap.isOpened())
		std::cout << "cannot open camera";
	else
		while (waitKey(25) != 27) {
			cap >> image;
			auto barcodes = ReadBarcodes(image);
			for (auto& barcode : barcodes)
				DrawBarcode(image, barcode);
			imshow("Display window", image);
		}

	return 0;
}